

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kkt_solver_basis.cc
# Opt level: O2

void __thiscall ipx::KKTSolverBasis::DropDual(KKTSolverBasis *this,Iterate *iterate,Info *info)

{
  ipxint *piVar1;
  double dVar2;
  uint uVar3;
  int iVar4;
  Basis *pBVar5;
  double *pdVar6;
  pointer piVar7;
  bool bVar8;
  BasicStatus BVar9;
  long lVar10;
  ostream *poVar11;
  Int IVar12;
  ulong uVar13;
  ipx *this_00;
  Int ii;
  ulong uVar14;
  double dVar15;
  double dVar16;
  Int pmax;
  double local_130;
  Info *local_128;
  KKTSolverBasis *local_120;
  Vector invscale_basic;
  vector<int,_std::allocator<int>_> candidates;
  anon_class_32_4_f929d714 search_pivot;
  double vmax;
  double s;
  IndexedVector ftran;
  bool exchanged;
  
  uVar3 = this->model_->num_rows_;
  iVar4 = this->model_->num_cols_;
  IndexedVector::IndexedVector(&ftran,uVar3);
  local_130 = (this->control_->parameters_).super_ipx_parameters.ipm_drop_dual;
  (info->super_ipx_info).errflag = 0;
  candidates.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  candidates.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  candidates.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  IVar12 = 0;
  local_128 = info;
  while( true ) {
    search_pivot.invscale_basic = (Vector *)CONCAT44(search_pivot.invscale_basic._4_4_,IVar12);
    if ((int)(iVar4 + uVar3) <= IVar12) break;
    BVar9 = Basis::StatusOf(this->basis_,IVar12);
    if (BVar9 == NONBASIC) {
      lVar10 = (long)(int)search_pivot.invscale_basic;
      dVar2 = (iterate->zl_)._M_data[lVar10];
      dVar16 = (iterate->zu_)._M_data[lVar10];
      dVar15 = dVar16;
      if (dVar2 >= dVar16) {
        dVar15 = dVar2;
      }
      if ((dVar15 < (&iterate->xl_)[dVar2 < dVar16]._M_data[lVar10] * 0.01) && (dVar15 <= local_130)
         ) {
        std::vector<int,_std::allocator<int>_>::push_back
                  (&candidates,(value_type_conflict2 *)&search_pivot);
      }
    }
    IVar12 = (int)search_pivot.invscale_basic + 1;
  }
  if (candidates.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      candidates.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    std::valarray<double>::valarray(&invscale_basic,(long)(int)uVar3);
    pBVar5 = this->basis_;
    pdVar6 = (this->colscale_)._M_data;
    uVar13 = 0;
    uVar14 = (ulong)uVar3;
    if ((int)uVar3 < 1) {
      uVar14 = uVar13;
    }
    for (; uVar14 != uVar13; uVar13 = uVar13 + 1) {
      invscale_basic._M_data[uVar13] =
           1.0 / pdVar6[(pBVar5->basis_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar13]];
    }
    local_120 = this;
LAB_003808b8:
    if (candidates.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        candidates.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      iVar4 = candidates.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish[-1];
      local_130 = (double)(long)iVar4;
      s = (this->colscale_)._M_data[(long)local_130];
      Basis::SolveForUpdate(this->basis_,iVar4,&ftran);
      pmax = -1;
      vmax = 2.0;
      search_pivot.invscale_basic = &invscale_basic;
      search_pivot.s = &s;
      search_pivot.vmax = &vmax;
      search_pivot.pmax = &pmax;
      bVar8 = IndexedVector::sparse(&ftran);
      piVar7 = ftran.pattern_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (bVar8) {
        uVar3 = ftran.nnz_;
        if (ftran.nnz_ < 1) {
          uVar3 = 0;
        }
        for (uVar14 = 0; uVar3 != uVar14; uVar14 = uVar14 + 1) {
          DropDual::anon_class_32_4_f929d714::operator()
                    (&search_pivot,piVar7[uVar14],ftran.elements_._M_data[piVar7[uVar14]]);
        }
      }
      else {
        uVar3 = (uint)ftran.elements_._M_size;
        if ((int)(uint)ftran.elements_._M_size < 1) {
          uVar3 = 0;
        }
        for (uVar14 = 0; uVar3 != uVar14; uVar14 = uVar14 + 1) {
          DropDual::anon_class_32_4_f929d714::operator()
                    (&search_pivot,(Int)uVar14,ftran.elements_._M_data[uVar14]);
        }
      }
      this = local_120;
      if ((long)pmax < 0) {
        Iterate::make_fixed(iterate,iVar4);
        this = local_120;
        Basis::FixNonbasicVariable(local_120->basis_,iVar4);
        (this->colscale_)._M_data[(long)local_130] = 0.0;
        piVar1 = &(local_128->super_ipx_info).dual_dropped;
        *piVar1 = *piVar1 + 1;
        goto LAB_00380b12;
      }
      dVar2 = ftran.elements_._M_data[pmax];
      dVar16 = ABS(dVar2);
      if (dVar16 < 0.001) {
        poVar11 = Control::Debug(local_120->control_,3);
        this_00 = (ipx *)0x3b6778;
        poVar11 = std::operator<<(poVar11," |pivot| = ");
        sci2_abi_cxx11_((string *)&exchanged,this_00,dVar16);
        poVar11 = std::operator<<(poVar11,(string *)&exchanged);
        std::operator<<(poVar11," (dual nonbasic variable close to zero)\n");
        std::__cxx11::string::~string((string *)&exchanged);
      }
      IVar12 = Basis::ExchangeIfStable
                         (this->basis_,
                          (this->basis_->basis_).super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start[pmax],iVar4,dVar2,-1,&exchanged);
      (local_128->super_ipx_info).errflag = IVar12;
      if (IVar12 == 0) goto code_r0x00380a94;
    }
    operator_delete(invscale_basic._M_data);
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&candidates.super__Vector_base<int,_std::allocator<int>_>);
  IndexedVector::~IndexedVector(&ftran);
  return;
code_r0x00380a94:
  if (exchanged == true) {
    invscale_basic._M_data[pmax] = 1.0 / (this->colscale_)._M_data[(long)local_130];
    piVar1 = &(local_128->super_ipx_info).updates_ipm;
    *piVar1 = *piVar1 + 1;
    this->basis_changes_ = this->basis_changes_ + 1;
LAB_00380b12:
    candidates.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = candidates.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + -1;
  }
  goto LAB_003808b8;
}

Assistant:

void KKTSolverBasis::DropDual(Iterate* iterate, Info* info) {
    const Int m = model_.rows();
    const Int n = model_.cols();
    const Vector& xl = iterate->xl();
    const Vector& xu = iterate->xu();
    const Vector& zl = iterate->zl();
    const Vector& zu = iterate->zu();
    IndexedVector ftran(m);
    const double drop_dual = control_.ipm_drop_dual();
    const double volume_tol = 2.0;
    info->errflag = 0;

    std::vector<Int> candidates;
    for (Int jn = 0; jn < n+m; jn++) {
        if (basis_.StatusOf(jn) != Basis::NONBASIC)
            continue;
        assert(std::isfinite(xl[jn]) || std::isfinite(xu[jn]));
        assert(xl[jn] > 0.0);
        assert(xu[jn] > 0.0);
        assert(zl[jn] > 0.0 || zu[jn] > 0.0);
        double xj, zj;
        if (zl[jn] >= zu[jn]) { // choose larger dual variable
            xj = xl[jn];
            zj = zl[jn];
        } else {
            xj = xu[jn];
            zj = zu[jn];
        }
        if (zj < 0.01*xj && zj <= drop_dual)
            candidates.push_back(jn);
    }
    if (candidates.empty())
        return;

    // Maintain a copy of the inverse scaling factors of basic variables for
    // faster access.
    Vector invscale_basic(m);
    for (Int p = 0; p < m; p++) {
        Int j = basis_[p];
        invscale_basic[p] = 1.0 / colscale_[j];
        assert(std::isfinite(invscale_basic[p]));
        assert(invscale_basic[p] >= 0.0);
    }

    while (!candidates.empty()) {
        Int jn = candidates.back();
        // Pivot jn into the basis if volume increases sufficiently.
        const double s = colscale_[jn];
        basis_.SolveForUpdate(jn, ftran);
        Int pmax = -1;
        double vmax = volume_tol;
        auto search_pivot = [&](Int p, double pivot) {
            pivot = std::abs(pivot);
            if (pivot > kPivotZeroTol) {
                double v = pivot * invscale_basic[p] * s;
                if (v > vmax) {
                    vmax = v;
                    pmax = p;
                }
            }
        };
        for_each_nonzero(ftran, search_pivot);
        if (pmax >= 0) {
            double pivot = ftran[pmax];
            if (std::abs(pivot) < 1e-3)
                control_.Debug(3)
                    << " |pivot| = " << sci2(std::abs(pivot))
                    << " (dual nonbasic variable close to zero)\n";
            Int jb = basis_[pmax];
            // Pivot jn into the basis.
            assert(basis_.StatusOf(jb) == Basis::BASIC);
            bool exchanged;
            info->errflag = basis_.ExchangeIfStable(jb, jn, pivot, -1,
                                                    &exchanged);
            if (info->errflag)
                return;
            if (!exchanged)     // factorization was unstable, try again
                continue;
            invscale_basic[pmax] = 1.0 / colscale_[jn];
            assert(std::isfinite(invscale_basic[pmax]));
            assert(invscale_basic[pmax] >= 0.0);
            info->updates_ipm++;
            basis_changes_++;
        } else {
            // Make variable jn "fixed" at its current value.
            iterate->make_fixed(jn);
            basis_.FixNonbasicVariable(jn);
            colscale_[jn] = 0.0;
            info->dual_dropped++;
        }
        candidates.pop_back();
    }
}